

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tunings.h
# Opt level: O2

void __thiscall Tunings::Scale::Scale(Scale *this)

{
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  
  std::__cxx11::string::string((string *)this,"empty scale",&local_19);
  std::__cxx11::string::string((string *)&this->description,"",&local_1a);
  std::__cxx11::string::string((string *)&this->rawText,"",&local_1b);
  this->count = 0;
  (this->tones).super__Vector_base<Tunings::Tone,_std::allocator<Tunings::Tone>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tones).super__Vector_base<Tunings::Tone,_std::allocator<Tunings::Tone>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tones).super__Vector_base<Tunings::Tone,_std::allocator<Tunings::Tone>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Scale() : name("empty scale"), description(""), rawText(""), count(0) {}